

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WDString.cpp
# Opt level: O2

int index_kmp(string *S,string *T,int *next)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  uVar1 = T->_M_string_length;
  uVar2 = 1;
  iVar4 = 1;
  do {
    uVar3 = (ulong)uVar2;
    while( true ) {
      uVar5 = (ulong)iVar4;
      if ((S->_M_string_length < uVar3) || (uVar1 < uVar5)) {
        iVar4 = 0;
        if (uVar1 < uVar5) {
          iVar4 = uVar2 - (int)uVar1;
        }
        return iVar4;
      }
      if ((iVar4 == 0) || ((S->_M_dataplus)._M_p[uVar3] == (T->_M_dataplus)._M_p[uVar3])) break;
      iVar4 = next[uVar5];
    }
    uVar2 = uVar2 + 1;
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

int index_kmp(string S,string T,int next[])
{
    int i = 1, j = 1;
    while(i<=S.length() && j <=T.length())
    {
        if(j==0||S[i]==T[i])
        {
            ++i; ++j;
        }
        else j = next[j];
    }
    return (j>T.length()? i-T.length():0);
}